

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

void asmjit::x86::FuncInternal::unpackValues(FuncDetail *func,FuncValuePack *pack)

{
  uint uVar1;
  
  uVar1 = pack->_values[0]._data;
  if (((uVar1 & 0xfe) == 0x28) && (((func->_callConv)._arch & 1) != 0)) {
    pack->_values[0]._data = 0x27;
    pack->_values[1]._data = (uVar1 & 0xff) - 2;
  }
  return;
}

Assistant:

inline uint32_t typeId() const noexcept { return (_data & kTypeIdMask) >> kTypeIdShift; }